

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

int math_toint(lua_State *L)

{
  lua_Integer n_00;
  lua_Integer n;
  lua_State *plStack_10;
  int valid;
  lua_State *L_local;
  
  plStack_10 = L;
  n_00 = lua_tointegerx(L,1,(int *)((long)&n + 4));
  if (n._4_4_ == 0) {
    luaL_checkany(plStack_10,1);
    lua_pushnil(plStack_10);
  }
  else {
    lua_pushinteger(plStack_10,n_00);
  }
  return 1;
}

Assistant:

static int math_toint (lua_State *L) {
  int valid;
  lua_Integer n = lua_tointegerx(L, 1, &valid);
  if (valid)
    lua_pushinteger(L, n);
  else {
    luaL_checkany(L, 1);
    luaL_pushfail(L);  /* value is not convertible to integer */
  }
  return 1;
}